

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

bool Assimp::IFC::ProcessRepresentationItem
               (IfcRepresentationItem *item,uint matid,
               set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *mesh_indices,ConversionData *conv)

{
  bool bVar1;
  uint mat_index;
  uint64_t id;
  size_type sVar2;
  uint localmatid;
  ConversionData *conv_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *mesh_indices_local;
  uint matid_local;
  IfcRepresentationItem *item_local;
  
  id = STEP::Object::GetID((Object *)
                           ((long)&(item->
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   )._vptr_ObjectHelper +
                           (long)(item->
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 )._vptr_ObjectHelper[-3]));
  mat_index = ProcessMaterials(id,matid,conv,true);
  bVar1 = TryQueryMeshCache(item,mesh_indices,mat_index,conv);
  if (!bVar1) {
    bVar1 = ProcessGeometricItem(item,mat_index,mesh_indices,conv);
    if (!bVar1) {
      return false;
    }
    sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                      (mesh_indices);
    if (sVar2 != 0) {
      PopulateMeshCache(item,mesh_indices,mat_index,conv);
    }
  }
  return true;
}

Assistant:

bool ProcessRepresentationItem(const Schema_2x3::IfcRepresentationItem& item, unsigned int matid,
    std::set<unsigned int>& mesh_indices,
    ConversionData& conv)
{
    // determine material
    unsigned int localmatid = ProcessMaterials(item.GetID(), matid, conv, true);

    if (!TryQueryMeshCache(item,mesh_indices,localmatid,conv)) {
        if(ProcessGeometricItem(item,localmatid,mesh_indices,conv)) {
            if(mesh_indices.size()) {
                PopulateMeshCache(item,mesh_indices,localmatid,conv);
            }
        }
        else return false;
    }
    return true;
}